

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int read_line(lua_State *L,FILE *f,int chop)

{
  char *pcVar1;
  lua_Unsigned lVar2;
  bool bVar3;
  bool local_457;
  bool local_456;
  int local_454;
  int i;
  char *buff;
  undefined1 auStack_440 [4];
  int c;
  luaL_Buffer b;
  int chop_local;
  FILE *f_local;
  lua_State *L_local;
  
  b.init._1020_4_ = chop;
  luaL_buffinit(L,(luaL_Buffer *)auStack_440);
  do {
    pcVar1 = luaL_prepbuffsize((luaL_Buffer *)auStack_440,0x400);
    local_454 = 0;
    flockfile((FILE *)f);
    while( true ) {
      bVar3 = false;
      if (local_454 < 0x400) {
        buff._4_4_ = getc_unlocked((FILE *)f);
        bVar3 = false;
        if (buff._4_4_ != -1) {
          bVar3 = buff._4_4_ != 10;
        }
      }
      if (!bVar3) break;
      pcVar1[local_454] = (char)buff._4_4_;
      local_454 = local_454 + 1;
    }
    funlockfile((FILE *)f);
    b.size = (long)local_454 + b.size;
    local_456 = buff._4_4_ != -1 && buff._4_4_ != 10;
  } while (local_456);
  if ((b.init._1020_4_ == 0) && (buff._4_4_ == 10)) {
    if (b.b <= b.size) {
      luaL_prepbuffsize((luaL_Buffer *)auStack_440,1);
    }
    _auStack_440[b.size] = (char)buff._4_4_;
    b.size = b.size + 1;
  }
  luaL_pushresult((luaL_Buffer *)auStack_440);
  local_457 = true;
  if (buff._4_4_ != 10) {
    lVar2 = lua_rawlen(L,-1);
    local_457 = lVar2 != 0;
  }
  return (int)local_457;
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c;
  luaL_buffinit(L, &b);
  do {  /* may need to read several chunks to get whole line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer space */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;  /* read up to end of line or buffer limit */
    l_unlockfile(f);
    luaL_addsize(&b, i);
  } while (c != EOF && c != '\n');  /* repeat until end of line */
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}